

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rand.cpp
# Opt level: O3

void on_random_number_seed(ON__UINT32 s,ON_RANDOM_NUMBER_CONTEXT *randcontext)

{
  long lVar1;
  ON__UINT32 u;
  
  randcontext->mt[0] = s;
  lVar1 = 2;
  do {
    s = ((int)lVar1 + (s >> 0x1e ^ s) * 0x6c078965) - 1;
    randcontext->mt[lVar1 + -1] = s;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x271);
  randcontext->mti = 0x270;
  return;
}

Assistant:

void on_random_number_seed(ON__UINT32 s,ON_RANDOM_NUMBER_CONTEXT* randcontext)
{
  ON__UINT32 i, u;

#if defined(ON_COMPILER_MSC)
#pragma ON_PRAGMA_WARNING_PUSH
#pragma ON_PRAGMA_WARNING_DISABLE_MSC( 4127 ) // warning C4127: conditional expression is constant
#endif
  if ( N*sizeof(randcontext->mt[0]) != sizeof(randcontext->mt) )
  {
    ON_ERROR("the mt[] array in struct ON_RANDOM_NUMBER_CONTEXT must have length N.");
  }
#if defined(ON_COMPILER_MSC)
#pragma ON_PRAGMA_WARNING_POP
#endif

  randcontext->mt[0] = u = s & 0xffffffffUL;
  for (i=1; i<N; i++) 
  {
    u = (1812433253UL * (u ^ (u >> 30)) + i); 
    /* See Knuth TAOCP Vol2. 3rd Ed. P.106 for multiplier. */
    /* In the previous versions, MSBs of the seed affect   */
    /* only MSBs of the array mt[].                        */
    /* 2002/01/09 modified by Makoto Matsumoto             */

    u &= 0xffffffffUL;
    /* for confused people who end up with sizeof(ON__UINT32) > 4*/

    randcontext->mt[i] = u;
  }

  randcontext->mti = N;
}